

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O2

void get_comm(char **pt,char *kcomm,unsigned_long *stat)

{
  char cVar1;
  char *__src;
  ulong uVar2;
  ushort **ppuVar3;
  long lVar4;
  char *pcVar5;
  
  __src = *pt;
  uVar2 = 0x400;
  pcVar5 = __src;
  if (*__src == '/') goto LAB_0010f459;
  do {
    *stat = *stat | uVar2;
LAB_0010f459:
    lVar4 = (ulong)(((int)pcVar5 - (int)__src) + 1) << 0x20;
    do {
      cVar1 = pcVar5[1];
      if ((long)cVar1 == 0) {
        strncpy(kcomm,__src,lVar4 >> 0x20);
        kcomm[lVar4 >> 0x20] = '\0';
        return;
      }
      pcVar5 = pcVar5 + 1;
      ppuVar3 = __ctype_b_loc();
      lVar4 = lVar4 + 0x100000000;
    } while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x40) != 0);
    uVar2 = 0x800;
  } while( true );
}

Assistant:

void get_comm(char **pt,     		/* card string */
	    char *kcomm,		/* comment string */
	    unsigned long *stat		/* error number */
	   )
{        
    char *pi;
    int nchar = 0;
    char *p; 

    p = *pt;
    pi = p;
    if(*p != '/')  { 
      *stat |= NO_START_SLASH; 
    }
    p++;
    while(*p != '\0') {
        if(!isprint((int)*p) ) *stat |=  BAD_COMMENT;
        p++;
    }
    nchar = p - pi; 
    strncpy(kcomm,pi,nchar);
    *(kcomm+nchar) = '\0';
    return;
}